

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_list_column.h
# Opt level: O3

bool Gudhi::persistence_matrix::operator==
               (Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
                *c1,Intrusive_list_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
                    *c2)

{
  bool bVar1;
  node_ptr plVar2;
  node_ptr plVar3;
  Column_support *pCVar4;
  Column_support *pCVar5;
  size_t result;
  long lVar6;
  const_node_ptr p;
  node_ptr plVar7;
  node_ptr plVar8;
  
  bVar1 = true;
  if (c1 != c2) {
    plVar2 = (c1->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
    pCVar5 = &c1->column_;
    plVar3 = (c2->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
    pCVar4 = &c2->column_;
    lVar6 = 0;
    plVar7 = (node_ptr)pCVar5;
    do {
      plVar7 = (((type *)&plVar7->next_)->data_).root_plus_size_.m_header.super_node.next_;
      lVar6 = lVar6 + 1;
      plVar8 = (node_ptr)pCVar4;
    } while (plVar7 != (node_ptr)pCVar5);
    do {
      plVar8 = (((type *)&plVar8->next_)->data_).root_plus_size_.m_header.super_node.next_;
      lVar6 = lVar6 + -1;
    } while (plVar8 != (node_ptr)pCVar4);
    if (lVar6 == 0) {
      if (plVar3 != (node_ptr)pCVar4 && plVar2 != (node_ptr)pCVar5) {
        do {
          if ((*(int *)&plVar2[1].next_ != *(int *)&plVar3[1].next_) ||
             (*(int *)((long)(plVar2 + 0xffffffffffffffff) + 8) !=
              *(int *)((long)(plVar3 + 0xffffffffffffffff) + 8))) goto LAB_0013e538;
          plVar2 = plVar2->next_;
        } while ((plVar2 != (node_ptr)pCVar5) &&
                (plVar3 = plVar3->next_, plVar3 != (node_ptr)pCVar4));
      }
    }
    else {
LAB_0013e538:
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool operator==(const Intrusive_list_column& c1, const Intrusive_list_column& c2) {
    if (&c1 == &c2) return true;

    if constexpr (Master_matrix::Option_list::is_z2) {
      return c1.column_ == c2.column_;
    } else {
      auto it1 = c1.column_.begin();
      auto it2 = c2.column_.begin();
      if (c1.column_.size() != c2.column_.size()) return false;
      while (it1 != c1.column_.end() && it2 != c2.column_.end()) {
        if (it1->get_row_index() != it2->get_row_index() || it1->get_element() != it2->get_element()) return false;
        ++it1;
        ++it2;
      }
      return true;
    }
  }